

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::IsEntryForFieldNumTest_Matcher_Test::TestBody
          (IsEntryForFieldNumTest_Matcher_Test *this)

{
  bool bVar1;
  NotMatcherImpl<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *this_00;
  NotMatcherImpl<const_std::nullptr_t_&> *this_01;
  MatcherInterface<const_std::nullptr_t_&> *impl;
  ostream *poVar2;
  AssertionResult *pAVar3;
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*,_int,_int_*>
  *polymorphic_matcher_or_value;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Matcher<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> matcher;
  FieldEntry *local_3f0;
  AssertionResult local_3e8;
  _func_int **local_3d8;
  StringMatchResultListener listener;
  int table_field_numbers [3];
  AssertionResult gtest_ar;
  ostream local_218 [376];
  _func_int *local_a0;
  undefined2 local_98;
  undefined2 local_96;
  undefined8 local_94;
  undefined8 local_8c;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined1 auStack_48 [12];
  char acStack_3c [4];
  undefined8 uStack_38;
  undefined1 local_30;
  
  local_448._M_dataplus._M_p = (pointer)((long)&uStack_58 + 4);
  local_98 = 0;
  local_a0 = (_func_int *)0x0;
  local_96 = 0x48;
  local_94 = 0x70fffffff8;
  local_8c = 0;
  local_60 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_50 = 0;
  auStack_48._0_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  uStack_38 = 0;
  local_30 = 0;
  table_field_numbers[0] = 1;
  table_field_numbers[1] = 2;
  uStack_58 = 0xffffffff;
  table_field_numbers[2] = 3;
  listener.super_MatchResultListener.stream_._0_4_ = 1;
  listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)table_field_numbers;
  listener._16_8_ = &local_a0;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
  ::operator()(&gtest_ar,(char *)&listener,(FieldEntry **)"&entries[0]");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&listener);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x136,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_448,(Message *)&listener);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
    if (listener.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*listener.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  listener.super_MatchResultListener.stream_._0_4_ = 3;
  local_448._M_dataplus._M_p = auStack_48 + 0xc;
  listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)table_field_numbers;
  listener._16_8_ = &local_a0;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
  ::operator()(&gtest_ar,(char *)&listener,(FieldEntry **)"&entries[2]");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&listener);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x137,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_448,(Message *)&listener);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
    if (listener.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*listener.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_3e8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 3;
  local_3f0 = (FieldEntry *)auStack_48;
  local_3e8._0_8_ = table_field_numbers;
  local_3d8 = &local_a0;
  this_00 = (NotMatcherImpl<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)
            operator_new(0x20);
  testing::
  SafeMatcherCast<google::protobuf::internal::TcParseTableBase::FieldEntry*const&,google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*,int,int*>>
            ((Matcher<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)&listener
             ,(testing *)&local_3e8,polymorphic_matcher_or_value);
  testing::internal::
  NotMatcherImpl<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>::NotMatcherImpl
            (this_00,(Matcher<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)
                     &listener);
  testing::Matcher<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>::Matcher
            (&matcher,(MatcherInterface<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
                       *)this_00);
  testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
  ::~MatcherBase((MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *)
                 &listener);
  bVar1 = testing::internal::
          MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>::Matches
                    (&matcher.
                      super_MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
                     ,&local_3f0);
  if (bVar1) {
    testing::AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar);
    poVar2 = std::operator<<(local_218,"Value of: ");
    poVar2 = std::operator<<(poVar2,"&entries[1]");
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    testing::internal::
    MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>::DescribeTo
              (&matcher.
                super_MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
               ,local_218);
    testing::StringMatchResultListener::StringMatchResultListener(&listener);
    bVar1 = testing::internal::
            MatchPrintAndExplain<google::protobuf::internal::TcParseTableBase::FieldEntry*const,google::protobuf::internal::TcParseTableBase::FieldEntry*const&>
                      (&local_3f0,&matcher,&listener.super_MatchResultListener);
    if (bVar1) {
      std::operator<<(local_218,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(local_218,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    testing::AssertionFailure();
    std::__cxx11::stringbuf::str();
    pAVar3 = testing::AssertionResult::operator<<(&gtest_ar_3,&local_448);
    testing::AssertionResult::AssertionResult(&gtest_ar_2,pAVar3);
    std::__cxx11::string::~string((string *)&local_448);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_3.message_);
    testing::StringMatchResultListener::~StringMatchResultListener(&listener);
    std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar);
  }
  testing::internal::MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
  ::~MatcherBase(&matcher.
                  super_MatcherBase<google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
                );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&listener);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x139,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&listener);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (listener.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*listener.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_7_ = 0;
  this_01 = (NotMatcherImpl<const_std::nullptr_t_&> *)operator_new(0x20);
  impl = (MatcherInterface<const_std::nullptr_t_&> *)operator_new(0x20);
  (impl->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_01617e58;
  impl[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = &local_a0;
  *(undefined4 *)&impl[2].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = 1;
  impl[3].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)table_field_numbers;
  testing::Matcher<const_std::nullptr_t_&>::Matcher
            ((Matcher<const_std::nullptr_t_&> *)&listener,impl);
  testing::internal::NotMatcherImpl<const_std::nullptr_t_&>::NotMatcherImpl
            (this_01,(Matcher<const_std::nullptr_t_&> *)&listener);
  testing::Matcher<const_std::nullptr_t_&>::Matcher
            ((Matcher<const_std::nullptr_t_&> *)&matcher,
             (MatcherInterface<const_std::nullptr_t_&> *)this_01);
  testing::internal::MatcherBase<const_std::nullptr_t_&>::~MatcherBase
            ((MatcherBase<const_std::nullptr_t_&> *)&listener);
  bVar1 = testing::internal::MatcherBase<const_std::nullptr_t_&>::Matches
                    ((MatcherBase<const_std::nullptr_t_&> *)&matcher,(void **)&gtest_ar_2);
  if (bVar1) {
    testing::AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar);
    poVar2 = std::operator<<(local_218,"Value of: ");
    poVar2 = std::operator<<(poVar2,"nullptr");
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    testing::internal::MatcherBase<const_std::nullptr_t_&>::DescribeTo
              ((MatcherBase<const_std::nullptr_t_&> *)&matcher,local_218);
    testing::StringMatchResultListener::StringMatchResultListener(&listener);
    bVar1 = testing::internal::MatchPrintAndExplain<decltype(nullptr)const,decltype(nullptr)const&>
                      ((void **)&gtest_ar_2,(Matcher<const_std::nullptr_t_&> *)&matcher,
                       &listener.super_MatchResultListener);
    if (bVar1) {
      std::operator<<(local_218,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(local_218,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    testing::AssertionFailure();
    std::__cxx11::stringbuf::str();
    pAVar3 = testing::AssertionResult::operator<<(&local_3e8,&local_448);
    testing::AssertionResult::AssertionResult(&gtest_ar_3,pAVar3);
    std::__cxx11::string::~string((string *)&local_448);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_3e8.message_);
    testing::StringMatchResultListener::~StringMatchResultListener(&listener);
    std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar);
  }
  testing::internal::MatcherBase<const_std::nullptr_t_&>::~MatcherBase
            ((MatcherBase<const_std::nullptr_t_&> *)&matcher);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&listener);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x13b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&listener);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if (listener.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*listener.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  return;
}

Assistant:

TEST(IsEntryForFieldNumTest, Matcher) {
  // clang-format off
  TcParseTable<0, 3, 0, 0, 2> table = {
      // header:
      {
          0, 0,  // has_bits_offset, extensions
          0,     // max_field_number
          0,     // fast_idx_mask,
          offsetof(decltype(table), field_lookup_table),
          0xFFFFFFFF - 7,  // 7 = fields 1, 2, and 3.
          offsetof(decltype(table), field_names),
          0,           // num_field_entries
          0, 0,        // num_aux_entries, aux_offset,
          nullptr,     // default instance
          nullptr,     // post_loop_handler
          nullptr,     // fallback function
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          nullptr,     // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
      }};
  // clang-format on
  int table_field_numbers[] = {1, 2, 3};
  table.field_lookup_table = {{65535, 65535}};

  auto& entries = table.field_entries;
  EXPECT_THAT(&entries[0], IsEntryForFieldNum(&table, 1, table_field_numbers));
  EXPECT_THAT(&entries[2], IsEntryForFieldNum(&table, 3, table_field_numbers));
  EXPECT_THAT(&entries[1],
              Not(IsEntryForFieldNum(&table, 3, table_field_numbers)));

  EXPECT_THAT(nullptr, Not(IsEntryForFieldNum(&table, 1, table_field_numbers)));
}